

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O3

NativePixelAttribs Diligent::GetNativePixelTransferAttribs(TEXTURE_FORMAT TexFormat)

{
  undefined4 uVar1;
  undefined4 uVar2;
  array<Diligent::NativePixelAttribs,_106UL> *paVar3;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  NativePixelAttribs NVar4;
  string msg;
  char (*in_stack_ffffffffffffffc8) [2];
  char local_30 [4];
  uint local_2c;
  string local_28;
  
  if (GetNativePixelTransferAttribs(Diligent::TEXTURE_FORMAT)::FmtToGLPixelFmt == '\0') {
    GetNativePixelTransferAttribs();
    in_RDX = extraout_RDX_01;
  }
  if (GetNativePixelTransferAttribs(Diligent::TEXTURE_FORMAT)::bAttribsMapInitialized == '\0') {
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0].PixelFormat = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[1].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[1].DataType = 0x1406;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[1].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[2].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[2].DataType = 0x1406;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[2].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[3].PixelFormat = 0x8d99;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[3].DataType = 0x1405;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[3].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[4].PixelFormat = 0x8d99;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[4].DataType = 0x1404;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[4].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[5].PixelFormat = 0x1907;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[5].DataType = 0x1406;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[5].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[6].PixelFormat = 0x1907;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[6].DataType = 0x1406;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[6].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[7].PixelFormat = 0x8d98;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[7].DataType = 0x1405;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[7].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[8].PixelFormat = 0x8d98;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[8].DataType = 0x1404;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[8].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[9].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[9].DataType = 0x140b;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[9].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[10].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[10].DataType = 0x140b;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[10].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xb].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xb].DataType = 0x1403;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xb].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xc].PixelFormat = 0x8d99;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xc].DataType = 0x1403;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xc].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xd].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xd].DataType = 0x1402;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xd].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xe].PixelFormat = 0x8d99;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xe].DataType = 0x1402;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xe].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xf].PixelFormat = 0x8227;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xf].DataType = 0x1406;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0xf].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x10].PixelFormat = 0x8227;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x10].DataType = 0x1406;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x10].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x11].PixelFormat = 0x8228;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x11].DataType = 0x1405;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x11].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x12].PixelFormat = 0x8228;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x12].DataType = 0x1404;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x12].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x13].PixelFormat = 0x84f9;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x13].DataType = 0x8dad;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x13].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x14].PixelFormat = 0x84f9;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x14].DataType = 0x8dad;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x14].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x15].PixelFormat = 0x84f9;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x15].DataType = 0x8dad;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x15].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x16].PixelFormat = 0x84f9;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x16].DataType = 0x8dad;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x16].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x17].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x17].DataType = 0x8368;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x17].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x18].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x18].DataType = 0x8368;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x18].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x19].PixelFormat = 0x8d99;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x19].DataType = 0x8368;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x19].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1a].PixelFormat = 0x1907;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1a].DataType = 0x8c3b;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1a].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1b].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1b].DataType = 0x1401;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1b].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1c].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1c].DataType = 0x1401;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1c].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1d].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1d].DataType = 0x1401;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1d].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1e].PixelFormat = 0x8d99;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1e].DataType = 0x1401;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1e].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1f].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1f].DataType = 0x1400;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x1f].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x20].PixelFormat = 0x8d99;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x20].DataType = 0x1400;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x20].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x21].PixelFormat = 0x8227;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x21].DataType = 0x140b;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x21].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x22].PixelFormat = 0x8227;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x22].DataType = 0x140b;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x22].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x23].PixelFormat = 0x8227;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x23].DataType = 0x1403;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x23].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x24].PixelFormat = 0x8228;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x24].DataType = 0x1403;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x24].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x25].PixelFormat = 0x8227;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x25].DataType = 0x1402;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x25].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x26].PixelFormat = 0x8228;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x26].DataType = 0x1402;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x26].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x27].PixelFormat = 0x1903;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x27].DataType = 0x1406;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x27].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x28].PixelFormat = 0x1902;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x28].DataType = 0x1406;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x28].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x29].PixelFormat = 0x1903;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x29].DataType = 0x1406;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x29].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2a].PixelFormat = 0x8d94;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2a].DataType = 0x1405;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2a].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2b].PixelFormat = 0x8d94;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2b].DataType = 0x1404;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2b].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2c].PixelFormat = 0x84f9;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2c].DataType = 0x84fa;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2c].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2d].PixelFormat = 0x84f9;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2d].DataType = 0x84fa;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2d].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2e].PixelFormat = 0x84f9;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2e].DataType = 0x84fa;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2e].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2f].PixelFormat = 0x84f9;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2f].DataType = 0x84fa;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x2f].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x30].PixelFormat = 0x8227;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x30].DataType = 0x1401;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x30].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x31].PixelFormat = 0x8227;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x31].DataType = 0x1401;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x31].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x32].PixelFormat = 0x8228;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x32].DataType = 0x1401;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x32].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x33].PixelFormat = 0x8227;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x33].DataType = 0x1400;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x33].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x34].PixelFormat = 0x8228;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x34].DataType = 0x1400;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x34].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x35].PixelFormat = 0x1903;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x35].DataType = 0x140b;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x35].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x36].PixelFormat = 0x1903;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x36].DataType = 0x140b;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x36].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x37].PixelFormat = 0x1902;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x37].DataType = 0x1403;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x37].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x38].PixelFormat = 0x1903;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x38].DataType = 0x1403;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x38].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x39].PixelFormat = 0x8d94;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x39].DataType = 0x1403;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x39].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3a].PixelFormat = 0x1903;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3a].DataType = 0x1402;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3a].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3b].PixelFormat = 0x8d94;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3b].DataType = 0x1402;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3b].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3c].PixelFormat = 0x1903;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3c].DataType = 0x1401;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3c].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3d].PixelFormat = 0x1903;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3d].DataType = 0x1401;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3d].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3e].PixelFormat = 0x8d94;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3e].DataType = 0x1401;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3e].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3f].PixelFormat = 0x1903;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3f].DataType = 0x1400;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x3f].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x40].PixelFormat = 0x8d94;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x40].DataType = 0x1400;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x40].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x41].PixelFormat = 0x1903;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x41].DataType = 0x1401;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x41].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x42].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x42].PixelFormat = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x42].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x43].PixelFormat = 0x1907;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x43].DataType = 0x8c3e;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x43].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x44].PixelFormat = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x44].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x44].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x45].PixelFormat = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x45].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x45].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x46].PixelFormat = 0x1907;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x46].DataType = 0;
    in_RDX = 0x8c3e00001901;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x46].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x47].PixelFormat = 0x1907;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x47].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x47].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x48].PixelFormat = 0x1907;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x48].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x48].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x49].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x49].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x49].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4a].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4a].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4a].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4b].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4b].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4b].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4c].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4c].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4c].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4d].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4d].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4d].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4e].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4e].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4e].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4f].PixelFormat = 0x1903;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4f].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x4f].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x50].PixelFormat = 0x1903;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x50].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x50].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x51].PixelFormat = 0x1903;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x51].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x51].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x52].PixelFormat = 0x8227;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x52].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x52].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x53].PixelFormat = 0x8227;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x53].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x53].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x54].PixelFormat = 0x8227;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x54].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x54].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x55].PixelFormat = 0x1907;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x55].DataType = 0x8364;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x55].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x56].PixelFormat = 0x1907;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x56].DataType = 0x8366;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x56].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x57].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x57].DataType = 0x1401;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x57].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x58].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x58].PixelFormat = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x58].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x59].PixelFormat = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x59].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x59].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5a].PixelFormat = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5a].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5a].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5b].PixelFormat = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5b].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5b].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5c].PixelFormat = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5c].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5c].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5d].PixelFormat = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5d].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5d].IsCompressed = false;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5e].PixelFormat = 0x1907;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5e].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5e].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5f].PixelFormat = 0x1907;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5f].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x5f].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x60].PixelFormat = 0x1907;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x60].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x60].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x61].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x61].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x61].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x62].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x62].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x62].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[99].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[99].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[99].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[100].PixelFormat = 0x1907;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[100].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[100].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x65].PixelFormat = 0x1907;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x65].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x65].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x66].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x66].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x66].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x67].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x67].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x67].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x68].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x68].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x68].IsCompressed = true;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x69].PixelFormat = 0x1908;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x69].DataType = 0;
    GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems[0x69].IsCompressed = true;
    GetNativePixelTransferAttribs(Diligent::TEXTURE_FORMAT)::bAttribsMapInitialized = '\x01';
  }
  if ((ushort)(TexFormat - TEX_FORMAT_RGBA32_TYPELESS) < 0x69) {
    paVar3 = (array<Diligent::NativePixelAttribs,_106UL> *)
             (GetNativePixelTransferAttribs::FmtToGLPixelFmt._M_elems + TexFormat);
  }
  else {
    local_2c = (uint)TexFormat;
    local_30[0] = 'i';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    FormatString<char[17],int,char[31],int,char[2]>
              (&local_28,(Diligent *)"Texture format (",(char (*) [17])&local_2c,
               (int *)") is out of allowed range [1, ",(char (*) [31])local_30,(int *)0x8aeb7d,
               in_stack_ffffffffffffffc8);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetNativePixelTransferAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
               ,0x1b5);
    in_RDX = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
      in_RDX = extraout_RDX_00;
    }
    paVar3 = &GetNativePixelTransferAttribs::FmtToGLPixelFmt;
  }
  uVar1 = paVar3->_M_elems[0].PixelFormat;
  uVar2 = paVar3->_M_elems[0].DataType;
  NVar4.DataType = uVar2;
  NVar4.PixelFormat = uVar1;
  NVar4._8_4_ = (undefined4)CONCAT71((int7)((ulong)in_RDX >> 8),paVar3->_M_elems[0].IsCompressed);
  return NVar4;
}

Assistant:

NativePixelAttribs GetNativePixelTransferAttribs(TEXTURE_FORMAT TexFormat)
{
    // http://www.opengl.org/wiki/Pixel_Transfer

    static std::array<NativePixelAttribs, TEX_FORMAT_NUM_FORMATS> FmtToGLPixelFmt;

    static bool bAttribsMapInitialized = false;
    if (!bAttribsMapInitialized)
    {
        // clang-format off
        // http://www.opengl.org/wiki/Image_Format
        FmtToGLPixelFmt[TEX_FORMAT_UNKNOWN]                = NativePixelAttribs{};

        FmtToGLPixelFmt[TEX_FORMAT_RGBA32_TYPELESS]        = NativePixelAttribs{GL_RGBA,         GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA32_FLOAT]           = NativePixelAttribs{GL_RGBA,         GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA32_UINT]            = NativePixelAttribs{GL_RGBA_INTEGER, GL_UNSIGNED_INT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA32_SINT]            = NativePixelAttribs{GL_RGBA_INTEGER, GL_INT};

        FmtToGLPixelFmt[TEX_FORMAT_RGB32_TYPELESS]         = NativePixelAttribs{GL_RGB,         GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RGB32_FLOAT]            = NativePixelAttribs{GL_RGB,         GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RGB32_UINT]             = NativePixelAttribs{GL_RGB_INTEGER, GL_UNSIGNED_INT};
        FmtToGLPixelFmt[TEX_FORMAT_RGB32_SINT]             = NativePixelAttribs{GL_RGB_INTEGER, GL_INT};

        FmtToGLPixelFmt[TEX_FORMAT_RGBA16_TYPELESS]        = NativePixelAttribs{GL_RGBA,         GL_HALF_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA16_FLOAT]           = NativePixelAttribs{GL_RGBA,         GL_HALF_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA16_UNORM]           = NativePixelAttribs{GL_RGBA,         GL_UNSIGNED_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA16_UINT]            = NativePixelAttribs{GL_RGBA_INTEGER, GL_UNSIGNED_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA16_SNORM]           = NativePixelAttribs{GL_RGBA,         GL_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA16_SINT]            = NativePixelAttribs{GL_RGBA_INTEGER, GL_SHORT};

        FmtToGLPixelFmt[TEX_FORMAT_RG32_TYPELESS]          = NativePixelAttribs{GL_RG,           GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RG32_FLOAT]             = NativePixelAttribs{GL_RG,           GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RG32_UINT]              = NativePixelAttribs{GL_RG_INTEGER,   GL_UNSIGNED_INT};
        FmtToGLPixelFmt[TEX_FORMAT_RG32_SINT]              = NativePixelAttribs{GL_RG_INTEGER,   GL_INT};

        FmtToGLPixelFmt[TEX_FORMAT_R32G8X24_TYPELESS]      = NativePixelAttribs{GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV};
        FmtToGLPixelFmt[TEX_FORMAT_D32_FLOAT_S8X24_UINT]   = NativePixelAttribs{GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV};
        FmtToGLPixelFmt[TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS]=NativePixelAttribs{GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV};
        FmtToGLPixelFmt[TEX_FORMAT_X32_TYPELESS_G8X24_UINT]= NativePixelAttribs{GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV};

        // Components are normally packed with the first component in the most significant
        // bits of the bitfield, and successive component occupying progressively less
        // significant locations.Types whose token names end with _REV reverse the component
        // packing order from least to most significant locations.
        FmtToGLPixelFmt[TEX_FORMAT_RGB10A2_TYPELESS]       = NativePixelAttribs{GL_RGBA,         GL_UNSIGNED_INT_2_10_10_10_REV};
        FmtToGLPixelFmt[TEX_FORMAT_RGB10A2_UNORM]          = NativePixelAttribs{GL_RGBA,         GL_UNSIGNED_INT_2_10_10_10_REV};
        FmtToGLPixelFmt[TEX_FORMAT_RGB10A2_UINT]           = NativePixelAttribs{GL_RGBA_INTEGER, GL_UNSIGNED_INT_2_10_10_10_REV};
        FmtToGLPixelFmt[TEX_FORMAT_R11G11B10_FLOAT]        = NativePixelAttribs{GL_RGB,          GL_UNSIGNED_INT_10F_11F_11F_REV};

        FmtToGLPixelFmt[TEX_FORMAT_RGBA8_TYPELESS]         = NativePixelAttribs{GL_RGBA,         GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA8_UNORM]            = NativePixelAttribs{GL_RGBA,         GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA8_UNORM_SRGB]       = NativePixelAttribs{GL_RGBA,         GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA8_UINT]             = NativePixelAttribs{GL_RGBA_INTEGER, GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA8_SNORM]            = NativePixelAttribs{GL_RGBA,         GL_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA8_SINT]             = NativePixelAttribs{GL_RGBA_INTEGER, GL_BYTE};

        FmtToGLPixelFmt[TEX_FORMAT_RG16_TYPELESS]          = NativePixelAttribs{GL_RG,           GL_HALF_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RG16_FLOAT]             = NativePixelAttribs{GL_RG,           GL_HALF_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RG16_UNORM]             = NativePixelAttribs{GL_RG,           GL_UNSIGNED_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_RG16_UINT]              = NativePixelAttribs{GL_RG_INTEGER,   GL_UNSIGNED_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_RG16_SNORM]             = NativePixelAttribs{GL_RG,           GL_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_RG16_SINT]              = NativePixelAttribs{GL_RG_INTEGER,   GL_SHORT};

        FmtToGLPixelFmt[TEX_FORMAT_R32_TYPELESS]           = NativePixelAttribs{GL_RED,              GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_D32_FLOAT]              = NativePixelAttribs{GL_DEPTH_COMPONENT,  GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_R32_FLOAT]              = NativePixelAttribs{GL_RED,              GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_R32_UINT]               = NativePixelAttribs{GL_RED_INTEGER,      GL_UNSIGNED_INT};
        FmtToGLPixelFmt[TEX_FORMAT_R32_SINT]               = NativePixelAttribs{GL_RED_INTEGER,      GL_INT};

        FmtToGLPixelFmt[TEX_FORMAT_R24G8_TYPELESS]         = NativePixelAttribs{GL_DEPTH_STENCIL,    GL_UNSIGNED_INT_24_8};
        FmtToGLPixelFmt[TEX_FORMAT_D24_UNORM_S8_UINT]      = NativePixelAttribs{GL_DEPTH_STENCIL,    GL_UNSIGNED_INT_24_8};
        FmtToGLPixelFmt[TEX_FORMAT_R24_UNORM_X8_TYPELESS]  = NativePixelAttribs{GL_DEPTH_STENCIL,    GL_UNSIGNED_INT_24_8};
        FmtToGLPixelFmt[TEX_FORMAT_X24_TYPELESS_G8_UINT]   = NativePixelAttribs{GL_DEPTH_STENCIL,    GL_UNSIGNED_INT_24_8};

        FmtToGLPixelFmt[TEX_FORMAT_RG8_TYPELESS]           = NativePixelAttribs{GL_RG,           GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RG8_UNORM]              = NativePixelAttribs{GL_RG,           GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RG8_UINT]               = NativePixelAttribs{GL_RG_INTEGER,   GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RG8_SNORM]              = NativePixelAttribs{GL_RG,           GL_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RG8_SINT]               = NativePixelAttribs{GL_RG_INTEGER,   GL_BYTE};

        FmtToGLPixelFmt[TEX_FORMAT_R16_TYPELESS]           = NativePixelAttribs{GL_RED,          GL_HALF_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_R16_FLOAT]              = NativePixelAttribs{GL_RED,          GL_HALF_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_D16_UNORM]              = NativePixelAttribs{GL_DEPTH_COMPONENT, GL_UNSIGNED_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_R16_UNORM]              = NativePixelAttribs{GL_RED,          GL_UNSIGNED_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_R16_UINT]               = NativePixelAttribs{GL_RED_INTEGER,  GL_UNSIGNED_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_R16_SNORM]              = NativePixelAttribs{GL_RED,          GL_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_R16_SINT]               = NativePixelAttribs{GL_RED_INTEGER,  GL_SHORT};

        FmtToGLPixelFmt[TEX_FORMAT_R8_TYPELESS]            = NativePixelAttribs{GL_RED,          GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_R8_UNORM]               = NativePixelAttribs{GL_RED,          GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_R8_UINT]                = NativePixelAttribs{GL_RED_INTEGER,  GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_R8_SNORM]               = NativePixelAttribs{GL_RED,          GL_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_R8_SINT]                = NativePixelAttribs{GL_RED_INTEGER,  GL_BYTE};
        // To get the same behaviour as expected for TEX_FORMAT_A8_UNORM we swizzle the components
        // appropriately using the GL_TEXTURE_SWIZZLE texture parameters in TextureBaseGL::SetDefaultGLParameters()
        FmtToGLPixelFmt[TEX_FORMAT_A8_UNORM]               = NativePixelAttribs{GL_RED,          GL_UNSIGNED_BYTE};

        FmtToGLPixelFmt[TEX_FORMAT_R1_UNORM]               = NativePixelAttribs{};

        FmtToGLPixelFmt[TEX_FORMAT_RGB9E5_SHAREDEXP]       = NativePixelAttribs{GL_RGB, GL_UNSIGNED_INT_5_9_9_9_REV};
        FmtToGLPixelFmt[TEX_FORMAT_RG8_B8G8_UNORM]         = NativePixelAttribs{};
        FmtToGLPixelFmt[TEX_FORMAT_G8R8_G8B8_UNORM]        = NativePixelAttribs{};

        // http://www.g-truc.net/post-0335.html
        // http://renderingpipeline.com/2012/07/texture-compression/
        FmtToGLPixelFmt[TEX_FORMAT_BC1_TYPELESS]           = NativePixelAttribs{GL_RGB,  0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC1_UNORM]              = NativePixelAttribs{GL_RGB,  0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC1_UNORM_SRGB]         = NativePixelAttribs{GL_RGB,  0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC2_TYPELESS]           = NativePixelAttribs{GL_RGBA, 0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC2_UNORM]              = NativePixelAttribs{GL_RGBA, 0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC2_UNORM_SRGB]         = NativePixelAttribs{GL_RGBA, 0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC3_TYPELESS]           = NativePixelAttribs{GL_RGBA, 0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC3_UNORM]              = NativePixelAttribs{GL_RGBA, 0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC3_UNORM_SRGB]         = NativePixelAttribs{GL_RGBA, 0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC4_TYPELESS]           = NativePixelAttribs{GL_RED,  0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC4_UNORM]              = NativePixelAttribs{GL_RED,  0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC4_SNORM]              = NativePixelAttribs{GL_RED,  0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC5_TYPELESS]           = NativePixelAttribs{GL_RG,   0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC5_UNORM]              = NativePixelAttribs{GL_RG,   0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC5_SNORM]              = NativePixelAttribs{GL_RG,   0, True};
        FmtToGLPixelFmt[TEX_FORMAT_B5G6R5_UNORM]           = NativePixelAttribs{GL_RGB,  GL_UNSIGNED_SHORT_5_6_5_REV};
        FmtToGLPixelFmt[TEX_FORMAT_B5G5R5A1_UNORM]         = NativePixelAttribs{GL_RGB,  GL_UNSIGNED_SHORT_1_5_5_5_REV};
        // To get the same behaviour as expected for TEX_FORMAT_BGRA8_UNORM we swizzle the components
        // appropriately using the GL_TEXTURE_SWIZZLE texture parameters in TextureBaseGL::SetDefaultGLParameters()
        FmtToGLPixelFmt[TEX_FORMAT_BGRA8_UNORM]            = NativePixelAttribs{GL_RGBA, GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_BGRX8_UNORM]            = NativePixelAttribs{};
        FmtToGLPixelFmt[TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM] = NativePixelAttribs{};
        FmtToGLPixelFmt[TEX_FORMAT_BGRA8_TYPELESS]         = NativePixelAttribs{};
        FmtToGLPixelFmt[TEX_FORMAT_BGRA8_UNORM_SRGB]       = NativePixelAttribs{};
        FmtToGLPixelFmt[TEX_FORMAT_BGRX8_TYPELESS]         = NativePixelAttribs{};
        FmtToGLPixelFmt[TEX_FORMAT_BGRX8_UNORM_SRGB]       = NativePixelAttribs{};
        FmtToGLPixelFmt[TEX_FORMAT_BC6H_TYPELESS]          = NativePixelAttribs{GL_RGB,  0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_BC6H_UF16]              = NativePixelAttribs{GL_RGB,  0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_BC6H_SF16]              = NativePixelAttribs{GL_RGB,  0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_BC7_TYPELESS]           = NativePixelAttribs{GL_RGBA, 0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_BC7_UNORM]              = NativePixelAttribs{GL_RGBA, 0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_BC7_UNORM_SRGB]         = NativePixelAttribs{GL_RGBA, 0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_ETC2_RGB8_UNORM]        = NativePixelAttribs{GL_RGB,  0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_ETC2_RGB8_UNORM_SRGB]   = NativePixelAttribs{GL_RGB,  0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_ETC2_RGB8A1_UNORM]      = NativePixelAttribs{GL_RGBA, 0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB] = NativePixelAttribs{GL_RGBA, 0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_ETC2_RGBA8_UNORM]       = NativePixelAttribs{GL_RGBA, 0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB]  = NativePixelAttribs{GL_RGBA, 0,  True};
        // clang-format on
        bAttribsMapInitialized = true;
    }

    if (TexFormat > TEX_FORMAT_UNKNOWN && TexFormat < TEX_FORMAT_NUM_FORMATS)
    {
        return FmtToGLPixelFmt[TexFormat];
    }
    else
    {
        UNEXPECTED("Texture format (", int{TexFormat}, ") is out of allowed range [1, ", int{TEX_FORMAT_NUM_FORMATS} - 1, "]");
        return FmtToGLPixelFmt[0];
    }
}